

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O1

void cfd::TransactionContextUtil::AddScriptHashSign<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *signatures,
               Script *redeem_script,AddressType address_type,bool is_multisig_script)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  bool bVar3;
  bool bVar4;
  OutPoint *outpoint_00;
  char cVar5;
  SignDataType SVar6;
  CfdException *pCVar7;
  pointer puVar8;
  SignParameter *signature;
  pointer pSVar9;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> scriptsig;
  Script locking_script;
  AddressType local_12c;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_128;
  ConfidentialTransactionContext *local_110;
  ByteData local_108;
  SignParameter local_e8;
  OutPoint *local_70;
  Script local_68;
  
  local_12c = address_type;
  local_110 = transaction;
  cVar5 = cfd::core::Script::IsEmpty();
  if (cVar5 != '\0') {
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0xa7;
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "AddScriptHashSign";
    core::logger::log<>((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,
                        "Failed to AddScriptHashSign. Empty script.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_e8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Empty script.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_70 = outpoint;
  cVar5 = cfd::core::OutPoint::IsValid();
  if (cVar5 == '\0') {
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0xab;
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "AddScriptHashSign";
    core::logger::log<>((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,
                        "Failed to AddScriptHashSign. Invalid outpoint.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_e8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Invalid outpoint.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  pSVar9 = (signatures->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (signatures->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pSVar9 == pSVar2) {
      cfd::core::Script::Script(&local_68);
      local_128.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_12c == kP2shAddress) {
        bVar4 = true;
        bVar3 = false;
      }
      else if (local_12c == kP2wshAddress) {
        bVar3 = true;
        bVar4 = false;
      }
      else {
        if (local_12c != kP2shP2wshAddress) {
          local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
          local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xcf;
          local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = "AddScriptHashSign";
          core::logger::log<cfd::core::AddressType&>
                    ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,
                     "Failed to AddScriptHashSign. Invalid address_type: {}",&local_12c);
          pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
          local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)&local_e8.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,
                     "Invalid address_type. address_type must be \"p2wsh\" or \"p2sh-p2wsh\" or \"p2sh\"."
                     ,"");
          core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_e8);
          __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)&local_e8);
        cfd::core::Script::operator=(&local_68,(Script *)&local_e8);
        core::Script::~Script((Script *)&local_e8);
        bVar3 = true;
        bVar4 = true;
      }
      if (is_multisig_script) {
        if (bVar3) {
          cfd::core::ByteData::ByteData(&local_108);
          SignParameter::SignParameter(&local_e8,&local_108);
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
          emplace_back<cfd::SignParameter>(&local_128,&local_e8);
          local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b2f30;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.op_code_.text_data_._M_dataplus._M_p !=
              &local_e8.op_code_.text_data_.field_2) {
            operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
          }
          if (local_e8.related_pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.related_pubkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          puVar8 = local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
            puVar8 = local_108.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
        }
        else {
          SignParameter::SignParameter(&local_e8,(ScriptOperator *)&core::ScriptOperator::OP_0);
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
          emplace_back<cfd::SignParameter>(&local_128,&local_e8);
          local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b2f30;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.op_code_.text_data_._M_dataplus._M_p !=
              &local_e8.op_code_.text_data_.field_2) {
            operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
          }
          puVar8 = local_e8.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_e8.related_pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.related_pubkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
            puVar8 = local_e8.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
        }
        if (puVar8 != (pointer)0x0) {
          operator_delete(puVar8);
        }
      }
      pSVar9 = (signatures->
               super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pSVar2 = (signatures->
               super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pSVar9 != pSVar2) {
        do {
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    (&local_128,pSVar9);
          pSVar9 = pSVar9 + 1;
        } while (pSVar9 != pSVar2);
      }
      pSVar2 = local_128.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pSVar9 = local_128.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      SignParameter::SignParameter(&local_e8,redeem_script);
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
      emplace_back<cfd::SignParameter>(&local_128,&local_e8);
      paVar1 = &local_e8.op_code_.text_data_.field_2;
      local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b2f30;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.op_code_.text_data_._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
      }
      if (local_e8.related_pubkey_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.related_pubkey_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      outpoint_00 = local_70;
      if (bVar3) {
        AddSign<cfd::ConfidentialTransactionContext>
                  (local_110,local_70,&local_128,true,pSVar9 != pSVar2);
      }
      if (bVar4) {
        cVar5 = cfd::core::Script::IsEmpty();
        if (cVar5 == '\0') {
          local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          SignParameter::SignParameter(&local_e8,&local_68);
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
          emplace_back<cfd::SignParameter>
                    ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_108,
                     &local_e8);
          local_e8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b2f30;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.op_code_.text_data_._M_dataplus._M_p != paVar1) {
            operator_delete(local_e8.op_code_.text_data_._M_dataplus._M_p);
          }
          if (local_e8.related_pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.related_pubkey_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          AddSign<cfd::ConfidentialTransactionContext>
                    (local_110,outpoint_00,
                     (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_108,
                     false,true);
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                    ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_108);
        }
        else {
          AddSign<cfd::ConfidentialTransactionContext>
                    (local_110,outpoint_00,&local_128,false,pSVar9 != pSVar2);
        }
      }
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_128);
      core::Script::~Script(&local_68);
      return;
    }
    SVar6 = SignParameter::GetDataType(pSVar9);
    if ((SVar6 != kSign) && (SVar6 = SignParameter::GetDataType(pSVar9), SVar6 != kBinary)) break;
    pSVar9 = pSVar9 + 1;
  }
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xb3;
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "AddScriptHashSign";
  local_68._vptr_Script._0_4_ = SignParameter::GetDataType(pSVar9);
  core::logger::log<cfd::SignDataType&>
            ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,
             "Failed to AddScriptHashSign. Invalid signature type: {}",(SignDataType *)&local_68);
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_e8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "Invalid signature type. signature type must be \"kSign\" or \"kBinary\".","");
  core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&local_e8);
  __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContextUtil::AddScriptHashSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& signatures, const Script& redeem_script,
    AddressType address_type, bool is_multisig_script) {
  if (redeem_script.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddScriptHashSign. Empty script.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Empty script.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddScriptHashSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }
  for (const auto& signature : signatures) {
    if ((signature.GetDataType() != SignDataType::kSign) &&
        (signature.GetDataType() != SignDataType::kBinary)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddScriptHashSign. Invalid signature type: {}",
          signature.GetDataType());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid signature type. signature type must be \"kSign\" "
          "or \"kBinary\".");  // NOLINT
    }
  }

  bool has_witness = false;
  bool has_scriptsig = false;
  Script locking_script;
  std::vector<SignParameter> sign_params;
  switch (address_type) {
    case AddressType::kP2wshAddress:
      has_witness = true;
      break;
    case AddressType::kP2shP2wshAddress:
      has_witness = true;
      has_scriptsig = true;
      locking_script = ScriptUtil::CreateP2wshLockingScript(redeem_script);
      break;
    case AddressType::kP2shAddress:
      has_scriptsig = true;
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddScriptHashSign. Invalid address_type: {}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2wsh\" "
          "or \"p2sh-p2wsh\" or \"p2sh\".");  // NOLINT
  }
  if (is_multisig_script) {
    if (has_witness) {
      sign_params.push_back(SignParameter(ByteData()));
    } else {
      sign_params.push_back(SignParameter(ScriptOperator::OP_0));
    }
  }
  for (const auto& signature : signatures) {
    sign_params.push_back(signature);
  }
  bool clear_stack = (sign_params.empty()) ? false : true;
  sign_params.push_back(SignParameter(redeem_script));

  if (has_witness) {
    AddSign(transaction, outpoint, sign_params, true, clear_stack);
  }
  if (has_scriptsig) {
    if (!locking_script.IsEmpty()) {  // p2sh-p2wpkh
      std::vector<SignParameter> scriptsig;
      scriptsig.push_back(SignParameter(locking_script));
      AddSign(transaction, outpoint, scriptsig, false, true);
    } else {
      AddSign(transaction, outpoint, sign_params, false, clear_stack);
    }
  }
}